

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

void * xmlCopyEntity(void *payload,xmlChar *name)

{
  xmlEntityPtr entity;
  xmlChar *pxVar1;
  
  entity = (xmlEntityPtr)(*xmlMalloc)(0x90);
  if (entity == (xmlEntityPtr)0x0) {
    return (void *)0x0;
  }
  memset(entity,0,0x90);
  entity->type = XML_ENTITY_DECL;
  entity->etype = *(xmlEntityType *)((long)payload + 0x5c);
  if (*(xmlChar **)((long)payload + 0x10) != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
    entity->name = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012bd54;
  }
  if (*(xmlChar **)((long)payload + 0x60) != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x60));
    entity->ExternalID = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012bd54;
  }
  if (*(xmlChar **)((long)payload + 0x68) != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x68));
    entity->SystemID = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012bd54;
  }
  if (*(xmlChar **)((long)payload + 0x50) != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x50));
    entity->content = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012bd54;
  }
  if (*(xmlChar **)((long)payload + 0x48) != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x48));
    entity->orig = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012bd54;
  }
  if (*(xmlChar **)((long)payload + 0x78) == (xmlChar *)0x0) {
    return entity;
  }
  pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x78));
  entity->URI = pxVar1;
  if (pxVar1 != (xmlChar *)0x0) {
    return entity;
  }
LAB_0012bd54:
  xmlFreeEntity(entity);
  return (void *)0x0;
}

Assistant:

static void *
xmlCopyEntity(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlEntityPtr ent = (xmlEntityPtr) payload;
    xmlEntityPtr cur;

    cur = (xmlEntityPtr) xmlMalloc(sizeof(xmlEntity));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlEntity));
    cur->type = XML_ENTITY_DECL;

    cur->etype = ent->etype;
    if (ent->name != NULL) {
	cur->name = xmlStrdup(ent->name);
        if (cur->name == NULL)
            goto error;
    }
    if (ent->ExternalID != NULL) {
	cur->ExternalID = xmlStrdup(ent->ExternalID);
        if (cur->ExternalID == NULL)
            goto error;
    }
    if (ent->SystemID != NULL) {
	cur->SystemID = xmlStrdup(ent->SystemID);
        if (cur->SystemID == NULL)
            goto error;
    }
    if (ent->content != NULL) {
	cur->content = xmlStrdup(ent->content);
        if (cur->content == NULL)
            goto error;
    }
    if (ent->orig != NULL) {
	cur->orig = xmlStrdup(ent->orig);
        if (cur->orig == NULL)
            goto error;
    }
    if (ent->URI != NULL) {
	cur->URI = xmlStrdup(ent->URI);
        if (cur->URI == NULL)
            goto error;
    }
    return(cur);

error:
    xmlFreeEntity(cur);
    return(NULL);
}